

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O0

void bloaty::AddDIE(CU *cu,GeneralDIE *die,DualMap *symbol_map,RangeSink *sink)

{
  string_view data_00;
  string_view data_01;
  string_view available;
  string_view file_range;
  string_view file_range_00;
  string_view file_range_01;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  FILE *__stream;
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  uint8_t uVar4;
  uchar uVar5;
  uint uVar6;
  int iVar7;
  basic_string_view<char,_std::char_traits<char>_> *pbVar8;
  size_type sVar9;
  const_reference pvVar10;
  undefined8 uVar11;
  char *pcVar12;
  CompilationUnitSizes *pCVar13;
  unsigned_long uVar14;
  unsigned_long *puVar15;
  File *pFVar16;
  basic_string_view<char,_std::char_traits<char>_> *pbVar17;
  string *psVar18;
  const_pointer pvVar19;
  char *in_RCX;
  CU *in_RDI;
  string_view all_1;
  char *start_4;
  string_view data_1;
  uint64_t ranges_offset;
  string_view all;
  uint64_t end_1;
  uint64_t start_3;
  uint64_t length;
  uint64_t start_2;
  uint64_t end;
  uint64_t start_1;
  uint64_t base_address;
  bool done;
  char *start;
  string_view data;
  uint64_t offset;
  string_view offset_data;
  size_t offset_size;
  uint64_t range_list;
  string_view loc_range;
  uint64_t location_1;
  uint64_t size;
  uint64_t addr;
  string_view location;
  uint64_t low_pc;
  string_view *in_stack_fffffffffffffd38;
  string_view *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  RangeSink *in_stack_fffffffffffffd50;
  const_pointer pvVar20;
  RangeSink *in_stack_fffffffffffffd58;
  GeneralDIE *in_stack_fffffffffffffd60;
  CU *in_stack_fffffffffffffd68;
  size_t in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  RangeSink *in_stack_fffffffffffffd80;
  size_t in_stack_fffffffffffffd88;
  CU *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  string_view *in_stack_fffffffffffffdc8;
  RangeSink *in_stack_fffffffffffffdd0;
  uint64_t in_stack_fffffffffffffdd8;
  CU *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  undefined1 local_1a8 [16];
  const_pointer local_198;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  basic_string_view<char,_std::char_traits<char>_> *local_180;
  size_t local_178;
  char *local_170;
  undefined1 local_168 [16];
  basic_string_view<char,_std::char_traits<char>_> local_158;
  long local_148;
  RangeSink *local_140;
  unsigned_long local_138;
  char *local_130;
  uint64_t local_128;
  uint64_t local_120;
  uint64_t local_118;
  byte local_109;
  const_pointer local_108;
  size_t local_100;
  char *local_f8;
  string_view local_f0;
  uint64_t local_e0;
  size_t local_d8;
  char *local_d0;
  string_view local_c8;
  long local_b8;
  unsigned_long local_b0;
  size_t local_a8;
  char *local_a0;
  undefined1 local_98 [16];
  size_t local_88;
  char *local_80;
  CompilationUnitSizes local_74;
  string_view local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  char *local_50;
  ulong local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  uint64_t local_28;
  char *local_20;
  CU *local_8;
  
  local_20 = in_RCX;
  local_8 = in_RDI;
  local_28 = TryReadPcPair(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                           in_stack_fffffffffffffd58);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x200d7d);
  if (bVar2) {
    pbVar8 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                       ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x200d97
                       );
    local_38._M_len = pbVar8->_M_len;
    local_38._M_str = pbVar8->_M_str;
    sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_38);
    pCVar13 = dwarf::CU::unit_sizes(local_8);
    bVar3 = dwarf::CompilationUnitSizes::address_size(pCVar13);
    if ((sVar9 == (long)(int)(bVar3 + 1)) &&
       (pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_38,0),
       *pvVar10 == '\x03')) {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(&local_38,1);
      pCVar13 = dwarf::CU::unit_sizes(local_8);
      uVar4 = dwarf::CompilationUnitSizes::address_size(pCVar13);
      if (uVar4 == '\x04') {
        uVar6 = ReadFixed<unsigned_int,4ul>(in_stack_fffffffffffffd40);
        local_40 = (ulong)uVar6;
      }
      else {
        pCVar13 = dwarf::CU::unit_sizes(local_8);
        uVar4 = dwarf::CompilationUnitSizes::address_size(pCVar13);
        if (uVar4 != '\b') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/dwarf.cc"
                        ,0x1a9,
                        "void bloaty::AddDIE(const dwarf::CU &, const GeneralDIE &, const DualMap &, RangeSink *)"
                       );
        }
        local_40 = ReadFixed<unsigned_long,8ul>(in_stack_fffffffffffffd40);
      }
      bVar2 = RangeMap::TryGetSize
                        ((RangeMap *)in_stack_fffffffffffffd58,(uint64_t)in_stack_fffffffffffffd50,
                         (uint64_t *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      uVar1 = local_40;
      __stream = _stderr;
      if (bVar2) {
        dwarf::CU::unit_name_abi_cxx11_(local_8);
        RangeSink::AddVMRangeIgnoreDuplicate
                  (in_stack_fffffffffffffd50,
                   (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   (uint64_t)in_stack_fffffffffffffd40,(uint64_t)in_stack_fffffffffffffd38,
                   (string *)0x200f37);
      }
      else if (0 < verbose_level) {
        dwarf::CU::unit_name_abi_cxx11_(local_8);
        uVar11 = std::__cxx11::string::c_str();
        fprintf(__stream,
                "bloaty: warning: couldn\'t find DWARF location in symbol table, address: %lx, name: %s\n"
                ,uVar1,uVar11);
      }
    }
  }
  bVar2 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x200fb4);
  if (bVar2) {
    puVar15 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x200fce);
    in_stack_fffffffffffffdf0 = (char *)*puVar15;
    local_50 = in_stack_fffffffffffffdf0;
    pFVar16 = dwarf::CU::dwarf(local_8);
    pcVar12 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::size
                                (&pFVar16->debug_loc);
    if (in_stack_fffffffffffffdf0 < pcVar12) {
      dwarf::CU::dwarf(local_8);
      local_60 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58,
                            (size_type)in_stack_fffffffffffffd50);
      pCVar13 = dwarf::CU::unit_sizes(local_8);
      local_74 = *pCVar13;
      local_88 = local_60._M_len;
      local_80 = local_60._M_str;
      available._M_str = in_stack_fffffffffffffd78;
      available._M_len = in_stack_fffffffffffffd70;
      local_70 = dwarf::GetLocationListRange
                           (SUB84((ulong)in_stack_fffffffffffffd80 >> 0x20,0),available);
      in_stack_fffffffffffffde8 = local_20;
      local_60 = local_70;
      psVar18 = dwarf::CU::unit_name_abi_cxx11_(local_8);
      local_98 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar18);
      local_a8 = local_60._M_len;
      local_a0 = local_60._M_str;
      name._M_str = in_stack_fffffffffffffda0;
      name._M_len = (size_t)in_stack_fffffffffffffd98;
      file_range._M_str = (char *)in_stack_fffffffffffffd90;
      file_range._M_len = in_stack_fffffffffffffd88;
      RangeSink::AddFileRange(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,name,file_range);
    }
    else if (0 < verbose_level) {
      fprintf(_stderr,"bloaty: warning: DWARF location out of range, location=%lx\n",local_50);
    }
  }
  bVar2 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x20119f);
  if (bVar2) {
    puVar15 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x2011bc);
    local_b0 = *puVar15;
    pCVar13 = dwarf::CU::unit_sizes(local_8);
    bVar2 = dwarf::CompilationUnitSizes::dwarf64(pCVar13);
    iVar7 = 4;
    if (bVar2) {
      iVar7 = 8;
    }
    local_b8 = (long)iVar7;
    pFVar16 = dwarf::CU::dwarf(local_8);
    local_d8 = (pFVar16->debug_rnglists)._M_len;
    local_d0 = (pFVar16->debug_rnglists)._M_str;
    dwarf::CU::range_lists_base(local_8);
    data_00._M_len._4_4_ = in_stack_fffffffffffffd4c;
    data_00._M_len._0_4_ = in_stack_fffffffffffffd48;
    data_00._M_str = (char *)in_stack_fffffffffffffd50;
    local_c8 = StrictSubstr(data_00,(size_t)in_stack_fffffffffffffd40);
    dwarf::CU::unit_sizes(local_8);
    local_e0 = dwarf::CompilationUnitSizes::ReadDWARFOffset
                         ((CompilationUnitSizes *)in_stack_fffffffffffffd40,
                          in_stack_fffffffffffffd38);
    pFVar16 = dwarf::CU::dwarf(local_8);
    local_100 = (pFVar16->debug_rnglists)._M_len;
    local_f8 = (pFVar16->debug_rnglists)._M_str;
    dwarf::CU::range_lists_base(local_8);
    data_01._M_len._4_4_ = in_stack_fffffffffffffd4c;
    data_01._M_len._0_4_ = in_stack_fffffffffffffd48;
    data_01._M_str = (char *)in_stack_fffffffffffffd50;
    local_f0 = StrictSubstr(data_01,(size_t)in_stack_fffffffffffffd40);
    local_108 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_f0);
    local_109 = 0;
    local_118 = dwarf::CU::addr_base(local_8);
    while (((local_109 ^ 0xff) & 1) != 0) {
      uVar5 = ReadFixed<unsigned_char,1ul>(in_stack_fffffffffffffd40);
      switch(uVar5) {
      case '\0':
        local_109 = 1;
        break;
      case '\x01':
        dwarf::ReadLEB128<unsigned_long>((string_view *)in_stack_fffffffffffffd50);
        local_118 = dwarf::ReadIndirectAddress
                              ((CU *)in_stack_fffffffffffffd58,(uint64_t)in_stack_fffffffffffffd50);
        break;
      case '\x02':
        dwarf::ReadLEB128<unsigned_long>((string_view *)in_stack_fffffffffffffd50);
        local_120 = dwarf::ReadIndirectAddress
                              ((CU *)in_stack_fffffffffffffd58,(uint64_t)in_stack_fffffffffffffd50);
        dwarf::ReadLEB128<unsigned_long>((string_view *)in_stack_fffffffffffffd50);
        local_128 = dwarf::ReadIndirectAddress
                              ((CU *)in_stack_fffffffffffffd58,(uint64_t)in_stack_fffffffffffffd50);
        dwarf::CU::unit_name_abi_cxx11_(local_8);
        RangeSink::AddVMRangeIgnoreDuplicate
                  (in_stack_fffffffffffffd50,
                   (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   (uint64_t)in_stack_fffffffffffffd40,(uint64_t)in_stack_fffffffffffffd38,
                   (string *)0x20148c);
        break;
      case '\x03':
        in_stack_fffffffffffffd90 = local_8;
        dwarf::ReadLEB128<unsigned_long>((string_view *)in_stack_fffffffffffffd50);
        local_130 = (char *)dwarf::ReadIndirectAddress
                                      ((CU *)in_stack_fffffffffffffd58,
                                       (uint64_t)in_stack_fffffffffffffd50);
        local_138 = dwarf::ReadLEB128<unsigned_long>((string_view *)in_stack_fffffffffffffd50);
        in_stack_fffffffffffffd98 = local_20;
        in_stack_fffffffffffffda0 = local_130;
        dwarf::CU::unit_name_abi_cxx11_(local_8);
        RangeSink::AddVMRangeIgnoreDuplicate
                  (in_stack_fffffffffffffd50,
                   (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   (uint64_t)in_stack_fffffffffffffd40,(uint64_t)in_stack_fffffffffffffd38,
                   (string *)0x201527);
        break;
      case '\x04':
        uVar14 = dwarf::ReadLEB128<unsigned_long>((string_view *)in_stack_fffffffffffffd50);
        local_140 = (RangeSink *)(uVar14 + local_118);
        uVar14 = dwarf::ReadLEB128<unsigned_long>((string_view *)in_stack_fffffffffffffd50);
        local_148 = uVar14 + local_118;
        in_stack_fffffffffffffd88 = local_148 - (long)local_140;
        in_stack_fffffffffffffd78 = local_20;
        in_stack_fffffffffffffd80 = local_140;
        dwarf::CU::unit_name_abi_cxx11_(local_8);
        RangeSink::AddVMRangeIgnoreDuplicate
                  (in_stack_fffffffffffffd50,
                   (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   (uint64_t)in_stack_fffffffffffffd40,(uint64_t)in_stack_fffffffffffffd38,
                   (string *)0x2015c0);
        break;
      case '\x05':
      case '\x06':
      case '\a':
        Throw((char *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
      }
    }
    pvVar20 = local_108;
    pvVar19 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_f0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_158,pvVar20,(long)pvVar19 - (long)local_108);
    psVar18 = dwarf::CU::unit_name_abi_cxx11_(local_8);
    local_168 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar18);
    local_178 = local_158._M_len;
    local_170 = local_158._M_str;
    name_00._M_str = in_stack_fffffffffffffda0;
    name_00._M_len = (size_t)in_stack_fffffffffffffd98;
    file_range_00._M_str = (char *)in_stack_fffffffffffffd90;
    file_range_00._M_len = in_stack_fffffffffffffd88;
    RangeSink::AddFileRange
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,name_00,file_range_00);
  }
  else {
    local_180 = (basic_string_view<char,_std::char_traits<char>_> *)0xffffffffffffffff;
    bVar2 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x2016ba);
    if (bVar2) {
      puVar15 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x2016d4);
      local_180 = (basic_string_view<char,_std::char_traits<char>_> *)*puVar15;
    }
    else {
      bVar2 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x2016f5);
      if (bVar2) {
        puVar15 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x20170f);
        local_180 = (basic_string_view<char,_std::char_traits<char>_> *)*puVar15;
      }
    }
    if (local_180 != (basic_string_view<char,_std::char_traits<char>_> *)0xffffffffffffffff) {
      pbVar8 = local_180;
      pFVar16 = dwarf::CU::dwarf(local_8);
      pbVar17 = (basic_string_view<char,_std::char_traits<char>_> *)
                std::basic_string_view<char,_std::char_traits<char>_>::size(&pFVar16->debug_ranges);
      if (pbVar8 < pbVar17) {
        dwarf::CU::dwarf(local_8);
        local_190 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                              (pbVar8,(size_type)in_stack_fffffffffffffd58,
                               (size_type)in_stack_fffffffffffffd50);
        local_198 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_190);
        psVar18 = dwarf::CU::unit_name_abi_cxx11_(local_8);
        local_1a8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar18);
        name_02._M_str = in_stack_fffffffffffffdf0;
        name_02._M_len = (size_t)in_stack_fffffffffffffde8;
        dwarf::ReadRangeList
                  (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,name_02,
                   in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        pvVar20 = local_198;
        pvVar19 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_190);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_1b8,pvVar20,(long)pvVar19 - (long)local_198);
        psVar18 = dwarf::CU::unit_name_abi_cxx11_(local_8);
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar18);
        name_01._M_str = in_stack_fffffffffffffda0;
        name_01._M_len = (size_t)in_stack_fffffffffffffd98;
        file_range_01._M_str = (char *)in_stack_fffffffffffffd90;
        file_range_01._M_len = in_stack_fffffffffffffd88;
        RangeSink::AddFileRange
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,name_01,file_range_01);
      }
      else if (0 < verbose_level) {
        fprintf(_stderr,"bloaty: warning: DWARF debug range out of range, ranges_offset=%lx\n",
                local_180);
      }
    }
  }
  return;
}

Assistant:

void AddDIE(const dwarf::CU& cu, const GeneralDIE& die,
            const DualMap& symbol_map, RangeSink* sink) {
  uint64_t low_pc = TryReadPcPair(cu, die, sink);

  // Sometimes the DIE has a "location", which gives the location as an address.
  // This parses a very small subset of the overall DWARF expression grammar.
  if (die.location_string) {
    string_view location = *die.location_string;
    if (location.size() == cu.unit_sizes().address_size() + 1 &&
        location[0] == DW_OP_addr) {
      location.remove_prefix(1);
      uint64_t addr;
      // TODO(haberman): endian?
      if (cu.unit_sizes().address_size() == 4) {
        addr = ReadFixed<uint32_t>(&location);
      } else if (cu.unit_sizes().address_size() == 8) {
        addr = ReadFixed<uint64_t>(&location);
      } else {
        BLOATY_UNREACHABLE();
      }

      // Unfortunately the location doesn't include a size, so we look that part
      // up in the symbol map.
      uint64_t size;
      if (symbol_map.vm_map.TryGetSize(addr, &size)) {
        sink->AddVMRangeIgnoreDuplicate("dwarf_location", addr, size,
                                        cu.unit_name());
      } else {
        if (verbose_level > 0) {
          fprintf(stderr,
                  "bloaty: warning: couldn't find DWARF location in symbol "
                  "table, address: %" PRIx64 ", name: %s\n",
                  addr, cu.unit_name().c_str());
        }
      }
    }
  }

  // Sometimes a location is given as an offset into debug_loc.
  if (die.location_uint64) {
    uint64_t location = *die.location_uint64;;
    if (location < cu.dwarf().debug_loc.size()) {
      std::string_view loc_range = cu.dwarf().debug_loc.substr(location);
      loc_range = GetLocationListRange(cu.unit_sizes(), loc_range);
      sink->AddFileRange("dwarf_locrange", cu.unit_name(), loc_range);
    } else if (verbose_level > 0) {
      fprintf(stderr,
              "bloaty: warning: DWARF location out of range, location=%" PRIx64
              "\n",
              location);
    }
  }

  // DWARF 5 range list is the same information as "ranges" but in a different
  // format.
  if (die.rnglistx) {
    uint64_t range_list = *die.rnglistx;
    size_t offset_size = cu.unit_sizes().dwarf64() ? 8 : 4;
    string_view offset_data =
        StrictSubstr(cu.dwarf().debug_rnglists,
                     cu.range_lists_base() + (range_list * offset_size));
    uint64_t offset = cu.unit_sizes().ReadDWARFOffset(&offset_data);
    string_view data = StrictSubstr(
        cu.dwarf().debug_rnglists, cu.range_lists_base() + offset);
    const char* start = data.data();
    bool done = false;
    uint64_t base_address = cu.addr_base();
    while (!done) {
      switch (ReadFixed<uint8_t>(&data)) {
        case DW_RLE_end_of_list:
          done = true;
          break;
        case DW_RLE_base_addressx:
          base_address =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          break;
        case DW_RLE_startx_endx: {
          uint64_t start =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          uint64_t end =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          sink->AddVMRangeIgnoreDuplicate("dwarf_rangelst", start, end - start,
                                          cu.unit_name());
          break;
        }
        case DW_RLE_startx_length: {
          uint64_t start =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          uint64_t length = dwarf::ReadLEB128<uint64_t>(&data);
          sink->AddVMRangeIgnoreDuplicate("dwarf_rangelst", start, length,
                                          cu.unit_name());
          break;
        }
        case DW_RLE_offset_pair: {
          uint64_t start = dwarf::ReadLEB128<uint64_t>(&data) + base_address;
          uint64_t end = dwarf::ReadLEB128<uint64_t>(&data) + base_address;
          sink->AddVMRangeIgnoreDuplicate("dwarf_rangelst", start, end - start,
                                          cu.unit_name());
          break;
        }
        case DW_RLE_base_address:
        case DW_RLE_start_end:
        case DW_RLE_start_length:
          THROW("NYI");
          break;
      }
    }
    string_view all(start, data.data() - start);
    sink->AddFileRange("dwarf_rangelst_addrs", cu.unit_name(), all);
  } else {
    uint64_t ranges_offset = UINT64_MAX;

    // There are two different attributes that sometimes contain an offset into
    // debug_ranges.
    if (die.ranges) {
      ranges_offset = *die.ranges;
    } else if (die.start_scope) {
      ranges_offset = *die.start_scope;
    }

    if (ranges_offset != UINT64_MAX) {
      if (ranges_offset < cu.dwarf().debug_ranges.size()) {
        std::string_view data = cu.dwarf().debug_ranges.substr(ranges_offset);
        const char* start = data.data();
        ReadRangeList(cu, low_pc, cu.unit_name(), sink, &data);
        string_view all(start, data.data() - start);
        sink->AddFileRange("dwarf_debugrange", cu.unit_name(), all);
      } else if (verbose_level > 0) {
        fprintf(stderr,
                "bloaty: warning: DWARF debug range out of range, "
                "ranges_offset=%" PRIx64 "\n",
                ranges_offset);
      }
    }
  }
}